

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O3

void Gia_ManMarkFanoutDrivers(Gia_Man_t *p)

{
  byte *pbVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  
  if (0 < p->nObjs) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) {
        return;
      }
      uVar3 = *(ulong *)(&pGVar2->field_0x0 + lVar4);
      *(ulong *)(&pGVar2->field_0x0 + lVar4) = uVar3 & 0xffffffffbfffffff;
      uVar6 = (uint)(uVar3 & 0x1fffffff);
      if ((uVar3 & 0x1fffffff) == 0x1fffffff || (int)uVar3 < 0) {
        if ((int)uVar3 < 0 && uVar6 != 0x1fffffff) goto LAB_00792b85;
      }
      else {
        pbVar1 = (byte *)((long)pGVar2 + (ulong)(uVar6 << 2) * -3 + lVar4 + 3);
        *pbVar1 = *pbVar1 | 0x40;
        uVar6 = *(uint *)(&pGVar2->field_0x4 + lVar4) & 0x1fffffff;
LAB_00792b85:
        pbVar1 = (byte *)((long)pGVar2 + lVar4 + (ulong)(uVar6 << 2) * -3 + 3);
        *pbVar1 = *pbVar1 | 0x40;
      }
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0xc;
    } while (lVar5 < p->nObjs);
  }
  return;
}

Assistant:

void Gia_ManMarkFanoutDrivers( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    Gia_ManForEachObj( p, pObj, i )
    {
        pObj->fMark0 = 0;
        if ( Gia_ObjIsAnd(pObj) )
        {
            Gia_ObjFanin0(pObj)->fMark0 = 1;
            Gia_ObjFanin1(pObj)->fMark0 = 1;
        }
        else if ( Gia_ObjIsCo(pObj) )
            Gia_ObjFanin0(pObj)->fMark0 = 1;
    }
}